

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::BriefUnitTestResultPrinter::OnTestIterationEnd
          (BriefUnitTestResultPrinter *this,UnitTest *unit_test,int param_3)

{
  bool bVar1;
  uint uVar2;
  long *streamable;
  undefined8 uVar3;
  char *pcVar4;
  int num_disabled;
  int skipped_test_count;
  undefined8 in_stack_fffffffffffffee8;
  int test_count;
  string local_d8 [36];
  int local_b4;
  string local_b0 [32];
  TimeInMillis local_90;
  string local_88 [48];
  string local_58 [32];
  
  test_count = (int)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  ColoredPrintf(kGreen,"[==========] ");
  UnitTest::test_to_run_count((UnitTest *)0x20979e);
  FormatTestCount_abi_cxx11_(test_count);
  streamable = (long *)std::__cxx11::string::c_str();
  UnitTest::test_suite_to_run_count((UnitTest *)0x2097ce);
  FormatTestSuiteCount_abi_cxx11_(test_count);
  uVar3 = std::__cxx11::string::c_str();
  printf("%s from %s ran.",streamable,uVar3);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  if ((FLAGS_gtest_print_time & 1) != 0) {
    local_90 = UnitTest::elapsed_time((UnitTest *)0x209840);
    StreamableToString<long>(streamable);
    uVar3 = std::__cxx11::string::c_str();
    printf(" (%s ms total)",uVar3);
    std::__cxx11::string::~string(local_88);
  }
  printf("\n");
  ColoredPrintf(kGreen,"[  PASSED  ] ");
  UnitTest::successful_test_count((UnitTest *)0x209931);
  FormatTestCount_abi_cxx11_(test_count);
  uVar3 = std::__cxx11::string::c_str();
  printf("%s.\n",uVar3);
  std::__cxx11::string::~string(local_b0);
  local_b4 = UnitTest::skipped_test_count((UnitTest *)0x209978);
  if (0 < local_b4) {
    ColoredPrintf(kGreen,"[  SKIPPED ] ");
    FormatTestCount_abi_cxx11_((int)((ulong)local_d8 >> 0x20));
    uVar3 = std::__cxx11::string::c_str();
    printf("%s.\n",uVar3);
    std::__cxx11::string::~string(local_d8);
  }
  uVar2 = UnitTest::reportable_disabled_test_count((UnitTest *)0x209a2d);
  if ((uVar2 != 0) && ((FLAGS_gtest_also_run_disabled_tests & 1) == 0)) {
    bVar1 = UnitTest::Passed((UnitTest *)0x209a4e);
    if (bVar1) {
      printf("\n");
    }
    pcVar4 = "TESTS";
    if (uVar2 == 1) {
      pcVar4 = "TEST";
    }
    ColoredPrintf(kYellow,"  YOU HAVE %d DISABLED %s\n\n",(ulong)uVar2,pcVar4);
  }
  fflush(_stdout);
  return;
}

Assistant:

void BriefUnitTestResultPrinter::OnTestIterationEnd(const UnitTest& unit_test,
                                                    int /*iteration*/) {
  ColoredPrintf(GTestColor::kGreen, "[==========] ");
  printf("%s from %s ran.",
         FormatTestCount(unit_test.test_to_run_count()).c_str(),
         FormatTestSuiteCount(unit_test.test_suite_to_run_count()).c_str());
  if (GTEST_FLAG_GET(print_time)) {
    printf(" (%s ms total)",
           internal::StreamableToString(unit_test.elapsed_time()).c_str());
  }
  printf("\n");
  ColoredPrintf(GTestColor::kGreen, "[  PASSED  ] ");
  printf("%s.\n", FormatTestCount(unit_test.successful_test_count()).c_str());

  const int skipped_test_count = unit_test.skipped_test_count();
  if (skipped_test_count > 0) {
    ColoredPrintf(GTestColor::kGreen, "[  SKIPPED ] ");
    printf("%s.\n", FormatTestCount(skipped_test_count).c_str());
  }

  int num_disabled = unit_test.reportable_disabled_test_count();
  if (num_disabled && !GTEST_FLAG_GET(also_run_disabled_tests)) {
    if (unit_test.Passed()) {
      printf("\n");  // Add a spacer if no FAILURE banner is displayed.
    }
    ColoredPrintf(GTestColor::kYellow, "  YOU HAVE %d DISABLED %s\n\n",
                  num_disabled, num_disabled == 1 ? "TEST" : "TESTS");
  }
  // Ensure that Google Test output is printed before, e.g., heapchecker output.
  fflush(stdout);
}